

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileFunctions.h
# Opt level: O2

bool OpenFileForReading<char>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename,
               FFHANDLE *handle)

{
  FILE *pFVar1;
  char *local_40 [4];
  
  std::__cxx11::string::string((string *)local_40,(string *)filename);
  pFVar1 = fopen(local_40[0],"r");
  std::__cxx11::string::~string((string *)local_40);
  if (pFVar1 == (FILE *)0x0) {
    std::__cxx11::string::string((string *)local_40,(string *)filename);
    error("fopen(%s)",local_40[0]);
    std::__cxx11::string::~string((string *)local_40);
  }
  else {
    *handle = (FFHANDLE)pFVar1;
  }
  return pFVar1 != (FILE *)0x0;
}

Assistant:

bool OpenFileForReading(const std::basic_string<T>& filename, FFHANDLE& handle)
{
#ifdef _WIN32
    FFHANDLE h= CreateFile(ToTString(filename).c_str(), GENERIC_READ, FILE_SHARE_READ,
                NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    if (h==INVALID_HANDLE_VALUE || h==NULL)
    {
        logerror("CreateFile(%ls, READ)", filename.c_str());
        return false;
    }
    handle= h;

#endif
#ifdef _UNIX
    FILE *f= fopen(ToString(filename).c_str(), "r");
    if (f==NULL) {
        logerror("fopen(%s)", ToString(filename).c_str());
        return false;
    }
    handle= f;
#endif
    return true;
}